

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O3

void test_combinations<wchar_t,char>(void)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  method_type in_R8D;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  
  test_counter = test_counter + 1;
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (&local_60,(conv *)anon_var_dwarf_8d49,anon_var_dwarf_8d49 + 8,(char *)0x0,in_R8D);
  iVar3 = std::__cxx11::wstring::compare((wchar_t *)&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x12e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar5,(string *)&local_60);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (&local_40,(conv *)anon_var_dwarf_8d55,anon_var_dwarf_8d55 + 9,(char *)0x1,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x12f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop))",0x44);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    booster::locale::conv::utf_to_utf<wchar_t,char>
              (&local_60,(conv *)anon_var_dwarf_8d55,anon_var_dwarf_8d55 + 9,(char *)0x0,in_R8D);
    iVar3 = std::__cxx11::wstring::compare((wchar_t *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x130);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok())",0x33);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar3 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar5,(string *)&local_60);
        __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    return;
  }
  error_counter = error_counter + 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Error limits reached, stopping unit test","");
  booster::runtime_error::runtime_error(prVar5,(string *)&local_60);
  __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_combinations()
{
    using booster::locale::conv::utf_to_utf;
    typedef utfutf<CharOut> out;
    typedef utfutf<CharIn> in;
    TEST( (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok()) );
    TESTF( (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop)) );
    TEST( (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok()) );
}